

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O2

int ddSymmGroupMove(DdManager *table,int x,int y,Move **moves)

{
  uint uVar1;
  DdSubtable *pDVar2;
  DdHalfWord y_00;
  int iVar3;
  DdHalfWord x_00;
  DdNode *pDVar4;
  uint uVar5;
  DdHalfWord DVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  DdHalfWord DVar10;
  uint *puVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  
  uVar1 = table->subtables[x].next;
  iVar12 = x - uVar1;
  uVar7 = y;
  do {
    uVar5 = uVar7;
    uVar7 = table->subtables[(int)uVar5].next;
  } while (uVar5 < uVar7);
  iVar15 = uVar5 - y;
  iVar9 = 0;
  if (0 < iVar12 + 1) {
    iVar9 = iVar12 + 1;
  }
  iVar3 = -1;
  iVar13 = -1;
  if (-1 < iVar15) {
    iVar13 = iVar15;
  }
  DVar6 = 0xffffffff;
  DVar10 = 0xffffffff;
  x_00 = y;
  for (iVar14 = 1; iVar16 = iVar9, iVar14 != iVar13 + 2; iVar14 = iVar14 + 1) {
    while (y_00 = x_00, x_00 = x, iVar16 != 0) {
      iVar3 = cuddSwapInPlace(table,x_00,y_00);
      if (iVar3 == 0) goto LAB_0066aa7a;
      iVar16 = iVar16 + -1;
      x = x_00 - 1;
      DVar10 = y_00;
      DVar6 = x_00;
    }
    x_00 = iVar14 + y;
    x = (iVar14 + y) - 1;
  }
  iVar9 = 0;
  if (iVar15 < 1) {
    iVar15 = 0;
  }
  pDVar2 = table->subtables;
  lVar8 = (long)(int)uVar1;
  uVar7 = uVar1;
  for (; uVar7 = uVar7 + 1, iVar9 != iVar15; iVar9 = iVar9 + 1) {
    pDVar2[lVar8].next = (uint)(lVar8 + 1);
    lVar8 = lVar8 + 1;
  }
  iVar15 = (int)lVar8;
  iVar9 = 0;
  if (0 < iVar12) {
    iVar9 = iVar12;
  }
  pDVar2[iVar15].next = uVar1;
  lVar8 = (long)(int)uVar7 << 0x20;
  puVar11 = &pDVar2[(int)uVar7].next;
  for (iVar12 = 2; iVar12 - iVar9 != 2; iVar12 = iVar12 + 1) {
    *puVar11 = iVar15 + iVar12;
    lVar8 = lVar8 + 0x100000000;
    puVar11 = puVar11 + 0xe;
  }
  pDVar2[lVar8 >> 0x20].next = iVar15 + 1;
  pDVar4 = cuddDynamicAllocNode(table);
  if (pDVar4 == (DdNode *)0x0) {
LAB_0066aa7a:
    iVar3 = 0;
  }
  else {
    pDVar4->index = DVar6;
    pDVar4->ref = DVar10;
    *(int *)((long)&pDVar4->next + 4) = iVar3;
    (pDVar4->type).kids.T = (DdNode *)*moves;
    *moves = (Move *)pDVar4;
  }
  return iVar3;
}

Assistant:

static int
ddSymmGroupMove(
  DdManager * table,
  int  x,
  int  y,
  Move ** moves)
{
    Move *move;
    int  size = -1;
    int  i,j;
    int  xtop,xbot,xsize,ytop,ybot,ysize,newxtop;
    int  swapx = -1,swapy = -1;

#ifdef DD_DEBUG
    assert(x < y);      /* we assume that x < y */
#endif
    /* Find top, bottom, and size for the two groups. */
    xbot = x;
    xtop = table->subtables[x].next;
    xsize = xbot - xtop + 1;
    ybot = y;
    while ((unsigned) ybot < table->subtables[ybot].next)
        ybot = table->subtables[ybot].next;
    ytop = y;
    ysize = ybot - ytop + 1;

    /* Sift the variables of the second group up through the first group. */
    for (i = 1; i <= ysize; i++) {
        for (j = 1; j <= xsize; j++) {
            size = cuddSwapInPlace(table,x,y);
            if (size == 0) return(0);
            swapx = x; swapy = y;
            y = x;
            x = y - 1;
        }
        y = ytop + i;
        x = y - 1;
    }

    /* fix symmetries */
    y = xtop; /* ytop is now where xtop used to be */
    for (i = 0; i < ysize-1 ; i++) {
        table->subtables[y].next = y + 1;
        y = y + 1;
    }
    table->subtables[y].next = xtop; /* y is bottom of its group, join */
                                     /* its symmetry to top of its group */
    x = y + 1;
    newxtop = x;
    for (i = 0; i < xsize - 1 ; i++) {
        table->subtables[x].next = x + 1;
        x = x + 1;
    }
    table->subtables[x].next = newxtop; /* x is bottom of its group, join */
                                        /* its symmetry to top of its group */
    /* Store group move */
    move = (Move *) cuddDynamicAllocNode(table);
    if (move == NULL) return(0);
    move->x = swapx;
    move->y = swapy;
    move->size = size;
    move->next = *moves;
    *moves = move;

    return(size);

}